

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceTest_TestNonZeroMapEntriesExplicitMessageValuePopulatedInGenCode_Test::
NoFieldPresenceTest_TestNonZeroMapEntriesExplicitMessageValuePopulatedInGenCode_Test
          (NoFieldPresenceTest_TestNonZeroMapEntriesExplicitMessageValuePopulatedInGenCode_Test
           *this)

{
  NoFieldPresenceTest_TestNonZeroMapEntriesExplicitMessageValuePopulatedInGenCode_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &
       PTR__NoFieldPresenceTest_TestNonZeroMapEntriesExplicitMessageValuePopulatedInGenCode_Test_029de1f0
  ;
  return;
}

Assistant:

TEST(NoFieldPresenceTest,
     TestNonZeroMapEntriesExplicitMessageValuePopulatedInGenCode) {
  // Set nonzero values for key-value pairs and test that.
  TestAllMapTypes message;
  (*message.mutable_map_int32_explicit_foreign_message())[456].set_c(20202);

  EXPECT_EQ(1, message.map_int32_explicit_foreign_message().size());
  // Keys can be found.
  EXPECT_TRUE(message.map_int32_explicit_foreign_message().contains(456));
  // Values are counted properly.
  EXPECT_EQ(1, message.map_int32_explicit_foreign_message().count(456));
  // Value can be retrieved.
  EXPECT_EQ(20202, message.map_int32_explicit_foreign_message().at(456).c());

  // Note that `has_foo` APIs are not available for implicit presence fields.
  // So there is no way to check has_field behaviour in gencode.
}